

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O0

void __thiscall ADSBHubConnection::ProcessPlaneData(ADSBHubConnection *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  LTFlightData *in_RDI;
  double dVar5;
  system_error *e;
  lock_guard<std::recursive_mutex> fdLock;
  LTFlightData *fd;
  unique_lock<std::mutex> mapFdLock;
  double dist;
  positionTy viewPos;
  FDStaticData *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  FDKeyTy *in_stack_fffffffffffffd38;
  undefined1 local_2b8 [7];
  undefined1 in_stack_fffffffffffffd4f;
  positionTy *in_stack_fffffffffffffd50;
  key_type *in_stack_fffffffffffffd58;
  map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
  *in_stack_fffffffffffffd60;
  undefined1 local_270 [92];
  DatRequTy in_stack_fffffffffffffdec;
  double in_stack_fffffffffffffdf0;
  FDStaticData *in_stack_fffffffffffffdf8;
  LTFlightData *in_stack_fffffffffffffe00;
  positionTy *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  FDDynamicData *in_stack_fffffffffffffef8;
  LTFlightData *in_stack_ffffffffffffff00;
  
  pdVar4 = positionTy::ts((positionTy *)
                          &in_RDI[1].dynDataDeque.
                           super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
                           ._M_impl.super__Deque_impl_data._M_map_size);
  uVar2 = std::isnan(*pdVar4);
  if ((uVar2 & 1) != 0) {
    dVar5 = GetSysTime();
    in_stack_fffffffffffffd38 = (FDKeyTy *)(dVar5 - 3.0);
    pdVar4 = positionTy::ts((positionTy *)
                            &in_RDI[1].dynDataDeque.
                             super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
                             ._M_impl.super__Deque_impl_data._M_map_size);
    *pdVar4 = (double)in_stack_fffffffffffffd38;
    in_RDI[1].posToAdd.super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node = (_Map_pointer)in_stack_fffffffffffffd38;
  }
  bVar1 = LTFlightData::FDKeyTy::empty((FDKeyTy *)0x18a1da);
  if ((!bVar1) &&
     (bVar1 = positionTy::isNormal(in_stack_fffffffffffffd50,(bool)in_stack_fffffffffffffd4f), bVar1
     )) {
    DataRefs::GetViewPos();
    dVar5 = positionTy::dist((positionTy *)
                             CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                             (positionTy *)in_stack_fffffffffffffd18);
    iVar3 = DataRefs::GetFdStdDistance_m(&dataRefs);
    if (dVar5 < (double)iVar3) {
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 (mutex_type *)in_stack_fffffffffffffd18);
      std::
      map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
      ::operator[](in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      std::lock_guard<std::recursive_mutex>::lock_guard
                ((lock_guard<std::recursive_mutex> *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 (mutex_type *)in_stack_fffffffffffffd18);
      std::unique_lock<std::mutex>::unlock
                ((unique_lock<std::mutex> *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
      in_stack_fffffffffffffd27 = LTFlightData::empty((LTFlightData *)0x18a2db);
      if ((bool)in_stack_fffffffffffffd27) {
        LTFlightData::SetKey(in_RDI,in_stack_fffffffffffffd38);
      }
      LTFlightData::UpdateData
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 in_stack_fffffffffffffdec);
      in_RDI[1].dynDataDeque.
      super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>.
      _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)in_RDI;
      LTFlightData::AddDynData
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                 in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::lock_guard<std::recursive_mutex>::~lock_guard
                ((lock_guard<std::recursive_mutex> *)0x18a3c0);
      std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    }
  }
  LTFlightData::FDKeyTy::clear((FDKeyTy *)in_stack_fffffffffffffd50);
  LTFlightData::FDStaticData::FDStaticData
            ((FDStaticData *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  LTFlightData::FDStaticData::operator=
            ((FDStaticData *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18);
  LTFlightData::FDStaticData::~FDStaticData
            ((FDStaticData *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  LTFlightData::FDDynamicData::FDDynamicData
            ((FDDynamicData *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  memcpy(&in_RDI[1].posToAdd.super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
          super__Deque_impl_data._M_start,local_270,0x48);
  positionTy::positionTy((positionTy *)local_2b8);
  memcpy(&in_RDI[1].dynDataDeque.
          super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
          ._M_impl.super__Deque_impl_data._M_map_size,local_2b8,0x48);
  return;
}

Assistant:

void ADSBHubConnection::ProcessPlaneData ()
{
    // if no timestamp then assume "3s ago"
    if (std::isnan(pos.ts()))
        dyn.ts = pos.ts() = GetSysTime() - 3.0;

    // Data collected?
    if (!fdKey.empty() && pos.isNormal(true))
    {
        // ADSBHub always sends _all_ data,
        // Filter data that the user doesn't want based on settings
        const positionTy viewPos = dataRefs.GetViewPos();
        const double dist = pos.dist(viewPos);
        if (dist < dataRefs.GetFdStdDistance_m() )
        {
            try {
                // from here on access to fdMap guarded by a mutex
                // until FD object is inserted and updated
                std::unique_lock<std::mutex> mapFdLock (mapFdMutex);

                // get the fd object from the map, key is the transpIcao
                // this fetches an existing or, if not existing, creates a new one
                LTFlightData& fd = mapFd[fdKey];
                
                // also get the data access lock once and for all
                // so following fetch/update calls only make quick recursive calls
                std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
                // now that we have the detail lock we can release the global one
                mapFdLock.unlock();

                // completely new? fill key fields
                if ( fd.empty() )
                    fd.SetKey(fdKey);
                
                // add the static data
                fd.UpdateData(stat, dist);

                // add the dynamic data
                dyn.pChannel = this;
                fd.AddDynData(dyn, 0, 0, &pos);

            } catch(const std::system_error& e) {
                LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
            }
        }
    }

    // Clear processed data
    fdKey.clear();
    stat = LTFlightData::FDStaticData();
    dyn = LTFlightData::FDDynamicData();
    pos = positionTy();
}